

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
ObjectTest_basic_value_constructor_Test::~ObjectTest_basic_value_constructor_Test
          (ObjectTest_basic_value_constructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(bool);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(signed_char_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(unsigned_char_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(short);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(int);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long_long_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(intmax_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(float);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(double);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long_double_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::u8string);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(object::array_type);

	// const char*
	{
		object obj{ u8"" };
		EXPECT_TRUE(obj.has<std::u8string>());
		EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
	}

	// std::u8string_view
	{
		object obj{ u8""sv };
		EXPECT_TRUE(obj.has<std::u8string>());
		EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
	}
}